

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_insert_multiple(planck_unit_test_t *tc)

{
  int iVar1;
  int iVar2;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_a0;
  int local_9c;
  ion_dictionary_t local_98;
  ion_dictionary_handler_t local_80;
  
  bhdct_setup(tc,&local_80,&local_98,ion_fill_none);
  iVar1 = 0x32;
  iVar2 = 100;
  do {
    local_a0 = iVar2;
    local_9c = iVar1;
    bhdct_insert(tc,&local_98,&local_9c,&local_a0,'\0');
    iVar1 = iVar1 + 1;
    iVar2 = iVar2 + 2;
  } while (iVar2 != 0x6e);
  bhdct_delete_dictionary(tc,&local_98);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_insert_multiple(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 50; i < 55; i++) {
		bhdct_insert(tc, &dict, IONIZE(i, int), IONIZE(i * 2, int), boolean_false);
	}

	bhdct_takedown(tc, &dict);
}